

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O1

int __thiscall cmProcess::ReportStatus(cmProcess *this)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  
  iVar1 = cmsysProcess_GetState(this->Process);
  iVar2 = 1;
  switch(iVar1) {
  case 0:
    pcVar6 = "cmProcess: Never started ";
    lVar5 = 0x19;
    goto LAB_002f5576;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"cmProcess: Error executing ",0x1b);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->Command)._M_dataplus._M_p,
                        (this->Command)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," process: ",10);
    pcVar6 = cmsysProcess_GetErrorString(this->Process);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar3);
    }
    pcVar6 = "\n";
    lVar5 = 1;
    break;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"cmProcess: ",0xb);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->Command)._M_dataplus._M_p,
                        (this->Command)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," process exited with an exception: ",0x23);
    iVar1 = cmsysProcess_GetExitException(this->Process);
    switch(iVar1) {
    case 0:
      pcVar6 = "None";
      lVar5 = 4;
      break;
    case 1:
      pcVar6 = "Segmentation fault";
      lVar5 = 0x12;
      break;
    case 2:
      pcVar6 = "Illegal instruction";
      goto LAB_002f5603;
    case 3:
      pcVar6 = "Interrupted by user";
      goto LAB_002f5603;
    case 4:
      pcVar6 = "Numerical exception";
LAB_002f5603:
      lVar5 = 0x13;
      break;
    case 5:
      pcVar6 = "Unknown";
      lVar5 = 7;
      break;
    default:
      goto switchD_002f5486_default;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
switchD_002f5486_default:
    poVar4 = (ostream *)&std::cerr;
    pcVar6 = "\n";
    lVar5 = 1;
    break;
  case 3:
    pcVar6 = "cmProcess: Never terminated ";
    lVar5 = 0x1c;
    goto LAB_002f5576;
  case 4:
    iVar2 = cmsysProcess_GetExitValue(this->Process);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"cmProcess: ",0xb);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->Command)._M_dataplus._M_p,
                        (this->Command)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," process exited with code ",0x1a);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    pcVar6 = "\n";
    lVar5 = 1;
    break;
  case 5:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"cmProcess: killed ",0x12);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->Command)._M_dataplus._M_p,
                        (this->Command)._M_string_length);
    pcVar6 = " process due to timeout.\n";
    lVar5 = 0x19;
    break;
  case 6:
    pcVar6 = "cmProcess: killed ";
    lVar5 = 0x12;
LAB_002f5576:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->Command)._M_dataplus._M_p,
                        (this->Command)._M_string_length);
    pcVar6 = " process.\n";
    lVar5 = 10;
    break;
  default:
    goto switchD_002f53a3_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
switchD_002f53a3_default:
  return iVar2;
}

Assistant:

int cmProcess::ReportStatus()
{
  int result = 1;
  switch(cmsysProcess_GetState(this->Process))
    {
    case cmsysProcess_State_Starting:
      {
      std::cerr << "cmProcess: Never started "
           << this->Command << " process.\n";
      } break;
    case cmsysProcess_State_Error:
      {
      std::cerr << "cmProcess: Error executing " << this->Command
                << " process: "
                << cmsysProcess_GetErrorString(this->Process)
                << "\n";
      } break;
    case cmsysProcess_State_Exception:
      {
      std::cerr << "cmProcess: " << this->Command
                      << " process exited with an exception: ";
      switch(cmsysProcess_GetExitException(this->Process))
        {
        case cmsysProcess_Exception_None:
          {
          std::cerr << "None";
          } break;
        case cmsysProcess_Exception_Fault:
          {
          std::cerr << "Segmentation fault";
          } break;
        case cmsysProcess_Exception_Illegal:
          {
          std::cerr << "Illegal instruction";
          } break;
        case cmsysProcess_Exception_Interrupt:
          {
          std::cerr << "Interrupted by user";
          } break;
        case cmsysProcess_Exception_Numerical:
          {
          std::cerr << "Numerical exception";
          } break;
        case cmsysProcess_Exception_Other:
          {
          std::cerr << "Unknown";
          } break;
        }
      std::cerr << "\n";
      } break;
    case cmsysProcess_State_Executing:
      {
      std::cerr << "cmProcess: Never terminated " <<
        this->Command << " process.\n";
      } break;
    case cmsysProcess_State_Exited:
      {
      result = cmsysProcess_GetExitValue(this->Process);
      std::cerr << "cmProcess: " << this->Command
                << " process exited with code "
                << result << "\n";
      } break;
    case cmsysProcess_State_Expired:
      {
      std::cerr << "cmProcess: killed " << this->Command
                << " process due to timeout.\n";
      } break;
    case cmsysProcess_State_Killed:
      {
      std::cerr << "cmProcess: killed " << this->Command << " process.\n";
      } break;
    }
  return result;

}